

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::SPxMainSM<double>::duplicateRows(SPxMainSM<double> *this,SPxLPBase<double> *lp,bool *again)

{
  VectorBase<double> *__x;
  VectorBase<double> *__x_00;
  int *piVar1;
  pointer pDVar2;
  double *pdVar3;
  Item *pIVar4;
  Nonzero<double> *pNVar5;
  Tolerances *pTVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  DataKey *pDVar8;
  char cVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  Result RVar14;
  long lVar15;
  DuplicateRowsPS *pDVar16;
  SPxOut *pSVar17;
  long lVar18;
  pointer pDVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  bool bVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  int *piVar28;
  DSVectorBase<double> *this_00;
  long lVar29;
  long in_FS_OFFSET;
  double dVar30;
  Real RVar31;
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  ulong uVar36;
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined4 uVar40;
  undefined4 uVar41;
  undefined1 auVar42 [16];
  int iVar43;
  int local_2c0;
  double local_2b8;
  int local_2a8;
  int local_2a4;
  int *perm_tmp;
  double local_288;
  undefined8 uStack_280;
  int *perm;
  bool *local_270;
  Real local_268;
  DataArray<int> da_perm;
  int *idxMem;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  undefined8 uStack_1f0;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  DataArray<int> pClass;
  ulong local_1a0;
  DataArray<bool> local_198;
  DataArray<bool> local_180;
  int local_164;
  int local_160;
  int local_15c;
  DataArray<bool> remRow;
  Array<double> scale;
  DataArray<int> classSize;
  shared_ptr<soplex::Tolerances> local_f8;
  shared_ptr<soplex::Tolerances> local_e8;
  VectorBase<double> newRhsVec;
  VectorBase<double> newLhsVec;
  DataArray<int> local_90;
  Array<double> local_78;
  DataArray<int> local_60;
  Array<double> local_48;
  
  local_15c = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  RVar14 = removeEmpty(this,lp);
  if (RVar14 == OKAY) {
    pClass.thesize = 0;
    if ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum < 1) {
      iVar22 = 0;
    }
    else {
      iVar22 = 0;
      do {
        pIVar4 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
        iVar20 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[pClass.thesize]
                 .idx;
        if (pIVar4[iVar20].data.super_SVectorBase<double>.memused == 1) {
          removeRowSingleton(this,lp,(SVectorBase<double> *)(pIVar4 + iVar20),&pClass.thesize);
          iVar22 = iVar22 + 1;
        }
        pClass.thesize = pClass.thesize + 1;
      } while (pClass.thesize < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum)
      ;
    }
    if (((0 < iVar22) &&
        (pSVar17 = (this->super_SPxSimplifier<double>).spxout, pSVar17 != (SPxOut *)0x0)) &&
       (pClass.thesize = pSVar17->m_verbosity, 3 < pClass.thesize)) {
      classSize.thesize = 4;
      (*pSVar17->_vptr_SPxOut[2])();
      pSVar17 = (this->super_SPxSimplifier<double>).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar17->m_streams[pSVar17->m_verbosity],
                 "Simplifier duplicate rows (row singleton stage) removed ",0x38);
      std::ostream::operator<<((ostream *)pSVar17->m_streams[pSVar17->m_verbosity],iVar22);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar17->m_streams[pSVar17->m_verbosity]," rows, ",7);
      std::ostream::operator<<((ostream *)pSVar17->m_streams[pSVar17->m_verbosity],iVar22);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar17->m_streams[pSVar17->m_verbosity]," non-zeros",10);
      cVar9 = (char)pSVar17->m_streams[pSVar17->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar17->m_streams[pSVar17->m_verbosity] + -0x18) + cVar9);
      std::ostream::put(cVar9);
      std::ostream::flush();
      pSVar17 = (this->super_SPxSimplifier<double>).spxout;
      (*pSVar17->_vptr_SPxOut[2])(pSVar17,&pClass);
    }
    pClass.thesize = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    RVar14 = OKAY;
    if (1 < pClass.thesize) {
      pClass.data = (int *)0x0;
      pClass.memFactor = 1.2;
      pClass.themax = pClass.thesize;
      spx_alloc<int*>(&pClass.data,pClass.thesize);
      iVar22 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      classSize.data = (int *)0x0;
      classSize.memFactor = 1.2;
      classSize.thesize = 0;
      if (0 < iVar22) {
        classSize.thesize = iVar22;
      }
      classSize.themax = 1;
      if (0 < iVar22) {
        classSize.themax = classSize.thesize;
      }
      spx_alloc<int*>(&classSize.data,classSize.themax);
      Array<double>::Array
                (&scale,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
      piVar28 = idxMem;
      *pClass.data = 0;
      *scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 0.0;
      *classSize.data = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      local_2c0 = 0;
      if (1 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
        lVar23 = 1;
        local_2c0 = 0;
        do {
          pClass.data[lVar23] = 0;
          scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar23] = 0.0;
          classSize.data[lVar23] = 0;
          idxMem[lVar23 + -1] = (int)lVar23;
          lVar23 = lVar23 + 1;
          local_2c0 = local_2c0 + 1;
        } while (lVar23 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
      }
      if (0 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
        dVar33 = 0.0;
        local_288 = 0.0;
        uStack_280 = 0;
        do {
          pIVar4 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                   (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[(long)dVar33]
                   .idx;
          local_1f8 = dVar33;
          if (0 < (pIVar4->data).super_SVectorBase<double>.memused) {
            lVar23 = 8;
            lVar29 = 0;
            do {
              pNVar5 = (pIVar4->data).super_SVectorBase<double>.m_elem;
              dVar33 = *(double *)((long)pNVar5 + lVar23 + -8);
              iVar22 = *(int *)((long)&pNVar5->val + lVar23);
              if ((scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar22] == 0.0) &&
                 (!NAN(scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar22]))) {
                scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar22] = dVar33;
              }
              this_00 = (this->m_classSetRows).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + pClass.data[iVar22];
              dVar33 = dVar33 / scale.data.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar22];
              DSVectorBase<double>::makeMem(this_00,1);
              if ((dVar33 != 0.0) || (NAN(dVar33))) {
                iVar20 = (this_00->super_SVectorBase<double>).memused;
                pNVar5 = (this_00->super_SVectorBase<double>).m_elem;
                pNVar5[iVar20].idx = iVar22;
                pNVar5[iVar20].val = dVar33;
                (this_00->super_SVectorBase<double>).memused = iVar20 + 1;
              }
              piVar1 = classSize.data + pClass.data[iVar22];
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                lVar18 = (long)local_2c0;
                local_2c0 = local_2c0 + 1;
                piVar28[lVar18] = pClass.data[iVar22];
              }
              lVar29 = lVar29 + 1;
              lVar23 = lVar23 + 0x10;
            } while (lVar29 < (pIVar4->data).super_SVectorBase<double>.memused);
          }
          if (0 < (pIVar4->data).super_SVectorBase<double>.memused) {
            lVar23 = 0;
            do {
              iVar22 = pClass.data[(pIVar4->data).super_SVectorBase<double>.m_elem[lVar23].idx];
              if (0 < (this->m_classSetRows).data.
                      super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar22].super_SVectorBase<double>.
                      memused) {
                pTVar6 = (this->super_SPxSimplifier<double>)._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var7 = (this->super_SPxSimplifier<double>)._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                  }
                }
                remRow._0_8_ = Tolerances::epsilon(pTVar6);
                if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                }
                pDVar19 = (this->m_classSetRows).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar20 = pDVar19[iVar22].super_SVectorBase<double>.memused;
                if (1 < iVar20) {
                  SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                            (pDVar19[iVar22].super_SVectorBase<double>.m_elem,iVar20,
                             (ElementCompare *)&remRow,0,true);
                }
                iVar20 = *piVar28;
                lVar29 = (long)local_2c0;
                local_2c0 = local_2c0 + -1;
                *piVar28 = piVar28[lVar29 + -1];
                pDVar19 = (this->m_classSetRows).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < pDVar19[iVar22].super_SVectorBase<double>.memused) {
                  pDVar2 = pDVar19 + iVar22;
                  lVar18 = 0;
                  lVar29 = 0;
                  do {
                    if (lVar18 != 0) {
                      dVar33 = *(double *)
                                ((long)&((pDVar2->super_SVectorBase<double>).m_elem)->val + lVar18);
                      dVar30 = epsZero(this);
                      uVar36 = (ulong)DAT_00601100;
                      dVar34 = (double)((ulong)dVar33 & uVar36);
                      if (dVar34 <= (double)((ulong)local_288 & uVar36)) {
                        dVar34 = (double)((ulong)local_288 & uVar36);
                      }
                      if (dVar34 <= 1.0) {
                        dVar34 = 1.0;
                      }
                      if (dVar30 < (double)((ulong)((dVar33 - local_288) / dVar34) & uVar36)) {
                        iVar20 = *piVar28;
                        lVar15 = (long)local_2c0;
                        local_2c0 = local_2c0 + -1;
                        *piVar28 = piVar28[lVar15 + -1];
                      }
                    }
                    pNVar5 = (this->m_classSetRows).data.
                             super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar22].
                             super_SVectorBase<double>.m_elem;
                    pClass.data[*(int *)((long)&pNVar5->idx + lVar18)] = iVar20;
                    classSize.data[iVar20] = classSize.data[iVar20] + 1;
                    local_288 = *(double *)((long)&pNVar5->val + lVar18);
                    uStack_280 = 0;
                    lVar29 = lVar29 + 1;
                    pDVar19 = (this->m_classSetRows).data.
                              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pDVar2 = pDVar19 + iVar22;
                    lVar18 = lVar18 + 0x10;
                  } while (lVar29 < (pDVar2->super_SVectorBase<double>).memused);
                }
                pDVar19[iVar22].super_SVectorBase<double>.memused = 0;
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 < (pIVar4->data).super_SVectorBase<double>.memused);
          }
          dVar33 = (double)((long)local_1f8 + 1);
        } while ((long)dVar33 <
                 (long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      }
      free(idxMem);
      idxMem = (int *)0x0;
      iVar22 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      remRow.data = (bool *)0x0;
      remRow.memFactor = 1.2;
      remRow.thesize = 0;
      if (0 < iVar22) {
        remRow.thesize = iVar22;
      }
      remRow.themax = 1;
      if (0 < iVar22) {
        remRow.themax = remRow.thesize;
      }
      spx_alloc<bool*>(&remRow.data,remRow.themax);
      auVar12 = _DAT_006011a0;
      auVar11 = _DAT_00601040;
      iVar22 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      if (0 < (long)iVar22) {
        pDVar19 = (this->m_dupRows).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar23 = (long)iVar22 + -1;
        auVar32._8_4_ = (int)lVar23;
        auVar32._0_8_ = lVar23;
        auVar32._12_4_ = (int)((ulong)lVar23 >> 0x20);
        lVar23 = 0;
        auVar32 = auVar32 ^ _DAT_00601040;
        auVar35 = _DAT_00601020;
        auVar39 = _DAT_00601030;
        do {
          auVar42 = auVar39 ^ auVar11;
          iVar20 = auVar32._4_4_;
          if ((bool)(~(auVar42._4_4_ == iVar20 && auVar32._0_4_ < auVar42._0_4_ ||
                      iVar20 < auVar42._4_4_) & 1)) {
            *(undefined4 *)((long)&(pDVar19->super_SVectorBase<double>).memused + lVar23) = 0;
          }
          if ((auVar42._12_4_ != auVar32._12_4_ || auVar42._8_4_ <= auVar32._8_4_) &&
              auVar42._12_4_ <= auVar32._12_4_) {
            *(undefined4 *)((long)&pDVar19[1].super_SVectorBase<double>.memused + lVar23) = 0;
          }
          auVar42 = auVar35 ^ auVar11;
          iVar43 = auVar42._4_4_;
          if (iVar43 <= iVar20 && (iVar43 != iVar20 || auVar42._0_4_ <= auVar32._0_4_)) {
            *(undefined4 *)((long)&pDVar19[2].super_SVectorBase<double>.memused + lVar23) = 0;
            *(undefined4 *)((long)&pDVar19[3].super_SVectorBase<double>.memused + lVar23) = 0;
          }
          lVar29 = auVar39._8_8_;
          lVar18 = auVar12._0_8_;
          auVar39._0_8_ = auVar39._0_8_ + lVar18;
          lVar15 = auVar12._8_8_;
          auVar39._8_8_ = lVar29 + lVar15;
          lVar29 = auVar35._8_8_;
          auVar35._0_8_ = auVar35._0_8_ + lVar18;
          auVar35._8_8_ = lVar29 + lVar15;
          lVar23 = lVar23 + 0x80;
        } while ((ulong)(iVar22 + 3U >> 2) << 7 != lVar23);
      }
      uVar26 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      uVar36 = (ulong)uVar26;
      if (0 < (int)uVar26) {
        lVar23 = 0;
        do {
          remRow.data[lVar23] = false;
          DSVectorBase<double>::makeMem
                    ((this->m_dupRows).data.
                     super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + pClass.data[lVar23],1);
          lVar23 = lVar23 + 1;
          uVar36 = (ulong)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        } while (lVar23 < (long)uVar36);
      }
      perm_tmp = (int *)0x0;
      iVar22 = (int)uVar36;
      spx_alloc<int*>(&perm_tmp,iVar22);
      uVar36 = uVar36 & 0xffffffff;
      if (0 < iVar22) {
        memset(perm_tmp,0,uVar36 * 4);
      }
      if ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum < 1) {
        uVar27 = 0xffffffff;
        local_1a0 = 0xffffffff;
      }
      else {
        pDVar19 = (this->m_dupRows).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar4 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
        pDVar8 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey;
        uVar27 = 0xffffffff;
        uVar25 = 0;
        uVar26 = 0xffffffff;
        do {
          if ((1 < pDVar19[uVar25].super_SVectorBase<double>.memused) &&
             (pNVar5 = pDVar19[uVar25].super_SVectorBase<double>.m_elem,
             pIVar4[pDVar8[pNVar5->idx].idx].data.super_SVectorBase<double>.memused != 1)) {
            if ((int)uVar26 < 0) {
              uVar26 = (uint)uVar25;
            }
            if (1 < pDVar19[uVar25].super_SVectorBase<double>.memused) {
              piVar28 = &pNVar5[1].idx;
              lVar23 = 1;
              do {
                perm_tmp[*piVar28] = -1;
                lVar23 = lVar23 + 1;
                piVar28 = piVar28 + 4;
              } while (lVar23 < pDVar19[uVar25].super_SVectorBase<double>.memused);
            }
            uVar27 = uVar25 & 0xffffffff;
          }
          uVar25 = uVar25 + 1;
        } while ((long)uVar25 <
                 (long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
        local_1a0 = (ulong)uVar26;
      }
      if (0 < iVar22) {
        uVar25 = 0;
        iVar20 = 0;
        do {
          if (-1 < perm_tmp[uVar25]) {
            perm_tmp[uVar25] = iVar20;
            iVar20 = iVar20 + 1;
          }
          uVar25 = uVar25 + 1;
        } while (uVar36 != uVar25);
      }
      __x = &(lp->super_LPRowSetBase<double>).left;
      std::vector<double,_std::allocator<double>_>::vector(&newLhsVec.val,&__x->val);
      __x_00 = &(lp->super_LPRowSetBase<double>).right;
      std::vector<double,_std::allocator<double>_>::vector(&newRhsVec.val,&__x_00->val);
      iVar20 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      bVar24 = 0 < iVar20;
      if (iVar20 < 1) {
        bVar13 = false;
      }
      else {
        dVar33 = *(double *)(in_FS_OFFSET + -8);
        dVar34 = -dVar33;
        local_164 = iVar22;
        local_160 = iVar22;
        if (iVar22 < 1) {
          local_164 = 1;
          local_160 = 0;
        }
        uVar25 = 0;
        bVar13 = false;
        do {
          pDVar19 = (this->m_dupRows).data.
                    super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar20 = pDVar19[uVar25].super_SVectorBase<double>.memused;
          if ((1 < iVar20) &&
             ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
              [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
               [(pDVar19[uVar25].super_SVectorBase<double>.m_elem)->idx].idx].data.
              super_SVectorBase<double>.memused != 1)) {
            piVar28 = (this->m_stat).data;
            piVar28[0xc] = iVar20 + piVar28[0xc] + -1;
            ::soplex::infinity::__tls_init();
            ::soplex::infinity::__tls_init();
            iVar20 = (this->m_dupRows).data.
                     super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar25].super_SVectorBase<double>.
                     memused;
            local_270 = (bool *)0x0;
            local_268 = 1.2;
            iVar43 = iVar20;
            if (iVar20 < 1) {
              iVar43 = 0;
              iVar20 = 1;
            }
            perm = (int *)CONCAT44(iVar20,iVar43);
            spx_alloc<bool*>(&local_270,iVar20);
            pDVar19 = (this->m_dupRows).data.
                      super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_2b8 = dVar33;
            if (pDVar19[uVar25].super_SVectorBase<double>.memused < 1) {
              iVar20 = -1;
              local_2a8 = -1;
              local_2a4 = -1;
              local_288 = dVar34;
            }
            else {
              pDVar19 = pDVar19 + uVar25;
              local_2a4 = -1;
              lVar29 = 8;
              lVar23 = 0;
              local_2a8 = -1;
              iVar20 = -1;
              local_1f8 = dVar34;
              do {
                iVar43 = *(int *)((long)&((pDVar19->super_SVectorBase<double>).m_elem)->val + lVar29
                                 );
                local_288 = (__x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar43];
                dVar30 = (__x_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar43];
                local_270[lVar23] = local_288 == dVar30;
                if (iVar20 != -1) {
                  local_208 = scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start[iVar20] /
                              scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start[iVar43];
                  if (local_208 <= 0.0) {
                    ::soplex::infinity::__tls_init();
                    if (dVar33 <= dVar30) {
                      local_288 = dVar34;
                      ::soplex::infinity::__tls_init();
                      local_288 = dVar34;
                    }
                    else {
                      local_288 = (__x_00->val).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar43] * local_208;
                    }
                    dVar30 = (__x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar43];
                    ::soplex::infinity::__tls_init();
                    if (dVar30 <= dVar34) goto LAB_001efd61;
                    dVar30 = local_208 *
                             (__x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar43];
                  }
                  else {
                    ::soplex::infinity::__tls_init();
                    if (local_288 <= dVar34) {
                      local_288 = dVar34;
                      ::soplex::infinity::__tls_init();
                      local_288 = dVar34;
                    }
                    else {
                      local_288 = (__x->val).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar43] * local_208;
                    }
                    dVar30 = (__x_00->val).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[iVar43];
                    ::soplex::infinity::__tls_init();
                    if (dVar33 <= dVar30) {
LAB_001efd61:
                      ::soplex::infinity::__tls_init();
                      dVar30 = dVar33;
                    }
                    else {
                      dVar30 = local_208 *
                               (__x_00->val).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[iVar43];
                    }
                  }
                  if (local_1f8 < local_288) {
                    local_2a8 = iVar43;
                  }
                  if (dVar30 < local_2b8) {
                    local_2a4 = iVar43;
                  }
                  if (local_288 <= local_1f8) {
                    local_288 = local_1f8;
                  }
                  if (local_2b8 <= dVar30) {
                    dVar30 = local_2b8;
                  }
                  remRow.data[iVar43] = true;
                  iVar43 = iVar20;
                }
                local_2b8 = dVar30;
                iVar20 = iVar43;
                lVar23 = lVar23 + 1;
                pDVar19 = (this->m_dupRows).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar25;
                lVar29 = lVar29 + 0x10;
                local_1f8 = local_288;
              } while (lVar23 < (pDVar19->super_SVectorBase<double>).memused);
            }
            if (iVar20 == -1) {
              bVar10 = true;
            }
            else {
              dVar30 = (__x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar20];
              local_1f8 = local_288;
              if (local_288 <= dVar30) {
                local_1f8 = dVar30;
              }
              uStack_1f0 = 0;
              dVar30 = (__x_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar20];
              local_208 = local_2b8;
              if (dVar30 <= local_2b8) {
                local_208 = dVar30;
              }
              uStack_200 = 0;
              if (uVar25 == uVar27) {
                da_perm.data = (int *)0x0;
                da_perm.memFactor = 1.2;
                da_perm.themax = local_164;
                da_perm.thesize = local_160;
                spx_alloc<int*>(&da_perm.data,local_164);
                if (0 < iVar22) {
                  uVar21 = 0;
                  do {
                    da_perm.data[uVar21] = perm_tmp[uVar21];
                    uVar21 = uVar21 + 1;
                  } while (uVar36 != uVar21);
                }
                pDVar16 = (DuplicateRowsPS *)operator_new(0xd0);
                pDVar19 = (this->m_dupRows).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                Array<double>::Array(&local_48,&scale);
                DataArray<int>::DataArray(&local_60,&da_perm);
                local_180.thesize = (uint)perm;
                local_180.themax = perm._4_4_;
                local_180.data = (bool *)0x0;
                local_180.memFactor = local_268;
                spx_alloc<bool*>(&local_180.data,perm._4_4_);
                if ((ulong)(uint)local_180.thesize != 0) {
                  memcpy(local_180.data,local_270,(ulong)(uint)local_180.thesize);
                }
                pTVar6 = (this->super_SPxSimplifier<double>)._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var7 = (this->super_SPxSimplifier<double>)._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                  }
                }
                RVar31 = Tolerances::epsilon(pTVar6);
                dVar30 = (double)((ulong)local_1f8 & (ulong)DAT_00601100);
                dVar37 = (double)((ulong)local_208 & (ulong)DAT_00601100);
                if (dVar30 <= dVar37) {
                  dVar30 = dVar37;
                }
                if (dVar30 <= 1.0) {
                  dVar30 = 1.0;
                }
                local_e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (this->super_SPxSimplifier<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (this->super_SPxSimplifier<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
                if (local_e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_e8.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_e8.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                DuplicateRowsPS::DuplicateRowsPS
                          (pDVar16,lp,iVar20,local_2a8,local_2a4,pDVar19 + uVar25,&local_48,
                           &local_60,&local_180,true,ABS((local_1f8 - local_208) / dVar30) <= RVar31
                           ,&local_e8,uVar25 == local_1a0);
                ptr.
                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)pDVar16;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<soplex::SPxMainSM<double>::DuplicateRowsPS*>
                          (&ptr.
                            super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,pDVar16);
                if (local_e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_e8.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                }
                if (local_180.data != (bool *)0x0) {
                  free(local_180.data);
                  local_180.data = (bool *)0x0;
                }
                if (local_60.data != (int *)0x0) {
                  free(local_60.data);
                  local_60.data = (int *)0x0;
                }
                if (local_48.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_48.data.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_48.data.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_48.data.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                std::
                vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                ::push_back(&(this->m_hist).data,&ptr);
                if (ptr.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (ptr.
                             super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
              }
              else {
                da_perm.data = (int *)0x0;
                da_perm.memFactor = 1.2;
                da_perm.thesize = 0;
                da_perm.themax = 1;
                spx_alloc<int*>(&da_perm.data,1);
                pDVar16 = (DuplicateRowsPS *)operator_new(0xd0);
                pDVar19 = (this->m_dupRows).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                Array<double>::Array(&local_78,&scale);
                DataArray<int>::DataArray(&local_90,&da_perm);
                local_198.thesize = (uint)perm;
                local_198.themax = perm._4_4_;
                local_198.data = (bool *)0x0;
                local_198.memFactor = local_268;
                spx_alloc<bool*>(&local_198.data,perm._4_4_);
                if ((ulong)(uint)local_198.thesize != 0) {
                  memcpy(local_198.data,local_270,(ulong)(uint)local_198.thesize);
                }
                pTVar6 = (this->super_SPxSimplifier<double>)._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var7 = (this->super_SPxSimplifier<double>)._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                  }
                }
                RVar31 = Tolerances::epsilon(pTVar6);
                dVar30 = (double)((ulong)local_1f8 & (ulong)DAT_00601100);
                dVar37 = (double)((ulong)local_208 & (ulong)DAT_00601100);
                if (dVar30 <= dVar37) {
                  dVar30 = dVar37;
                }
                if (dVar30 <= 1.0) {
                  dVar30 = 1.0;
                }
                local_f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (this->super_SPxSimplifier<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (this->super_SPxSimplifier<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
                if (local_f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_f8.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_f8.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                DuplicateRowsPS::DuplicateRowsPS
                          (pDVar16,lp,iVar20,local_2a8,local_2a4,pDVar19 + uVar25,&local_78,
                           &local_90,&local_198,false,
                           ABS((local_1f8 - local_208) / dVar30) <= RVar31,&local_f8,
                           uVar25 == local_1a0);
                ptr.
                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)pDVar16;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<soplex::SPxMainSM<double>::DuplicateRowsPS*>
                          (&ptr.
                            super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,pDVar16);
                if (local_f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_f8.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                }
                if (local_198.data != (bool *)0x0) {
                  free(local_198.data);
                  local_198.data = (bool *)0x0;
                }
                if (local_90.data != (int *)0x0) {
                  free(local_90.data);
                  local_90.data = (int *)0x0;
                }
                if (local_78.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_78.data.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_78.data.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_78.data.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                std::
                vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                ::push_back(&(this->m_hist).data,&ptr);
                if (ptr.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (ptr.
                             super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
              }
              if (da_perm.data != (int *)0x0) {
                free(da_perm.data);
                da_perm.data = (int *)0x0;
              }
              bVar10 = true;
              pdVar3 = (__x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar20;
              if ((*pdVar3 <= local_288 && local_288 != *pdVar3) ||
                 (local_2b8 <
                  (__x_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar20])) {
                dVar37 = feastol(this);
                dVar30 = (double)((ulong)local_208 & (ulong)DAT_00601100);
                uVar40 = SUB84(local_1f8,0);
                uVar41 = (undefined4)((ulong)local_1f8 >> 0x20);
                dVar38 = (double)((ulong)local_1f8 & (ulong)DAT_00601100);
                if (dVar30 <= dVar38) {
                  dVar30 = dVar38;
                }
                if (dVar30 <= 1.0) {
                  dVar30 = 1.0;
                }
                if ((local_208 - local_1f8) / dVar30 <= -dVar37) {
                  free(perm_tmp);
                  perm_tmp = (int *)0x0;
                  bVar13 = true;
                  bVar10 = false;
                }
                else {
                  newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar20] = local_1f8;
                  if (local_1f8 <= local_208) {
                    uVar40 = SUB84(local_208,0);
                    uVar41 = (undefined4)((ulong)local_208 >> 0x20);
                  }
                  newRhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar20] = (double)CONCAT44(uVar41,uVar40);
                  bVar10 = true;
                  bVar13 = true;
                }
              }
            }
            if (local_270 != (bool *)0x0) {
              free(local_270);
              local_270 = (bool *)0x0;
            }
            if (!bVar10) break;
          }
          uVar25 = uVar25 + 1;
          lVar23 = (long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
          bVar24 = (long)uVar25 < lVar23;
        } while ((long)uVar25 < lVar23);
      }
      RVar14 = INFEASIBLE;
      if (!bVar24) {
        if (bVar13) {
          (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x38])
                    (lp,&newLhsVec,&newRhsVec,0);
        }
        uVar26 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        perm = (int *)0x0;
        spx_alloc<int*>(&perm,uVar26);
        if ((int)uVar26 < 1) {
          iVar20 = 0;
          iVar22 = 0;
        }
        else {
          pIVar4 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
          pDVar8 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey;
          uVar36 = 0;
          iVar22 = 0;
          iVar20 = 0;
          do {
            if (remRow.data[uVar36] == true) {
              perm[uVar36] = -1;
              iVar22 = iVar22 + 1;
              iVar20 = iVar20 + pIVar4[pDVar8[uVar36].idx].data.super_SVectorBase<double>.memused;
            }
            else {
              perm[uVar36] = 0;
            }
            uVar36 = uVar36 + 1;
          } while (uVar26 != uVar36);
        }
        (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x11])(lp,perm);
        if (0 < (int)uVar26) {
          piVar28 = (this->m_rIdx).data;
          uVar36 = 0;
          do {
            if (-1 < (long)perm[uVar36]) {
              piVar28[perm[uVar36]] = piVar28[uVar36];
            }
            uVar36 = uVar36 + 1;
          } while (uVar26 != uVar36);
        }
        free(perm);
        RVar14 = OKAY;
        perm = (int *)0x0;
        free(perm_tmp);
        perm_tmp = (int *)0x0;
        if (iVar22 + iVar20 != 0 && SCARRY4(iVar22,iVar20) == iVar22 + iVar20 < 0) {
          piVar28 = &(this->super_SPxSimplifier<double>).m_remRows;
          *piVar28 = *piVar28 + iVar22;
          piVar28 = &(this->super_SPxSimplifier<double>).m_remNzos;
          *piVar28 = *piVar28 + iVar20;
          pSVar17 = (this->super_SPxSimplifier<double>).spxout;
          if ((pSVar17 != (SPxOut *)0x0) && (3 < (int)pSVar17->m_verbosity)) {
            da_perm.thesize = pSVar17->m_verbosity;
            ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)
                     CONCAT44(ptr.
                              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,4);
            (*pSVar17->_vptr_SPxOut[2])();
            pSVar17 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,
                                         "Simplifier (duplicate rows) removed ");
            std::ostream::operator<<((ostream *)pSVar17->m_streams[pSVar17->m_verbosity],iVar22);
            pSVar17 = soplex::operator<<(pSVar17," rows, ");
            std::ostream::operator<<((ostream *)pSVar17->m_streams[pSVar17->m_verbosity],iVar20);
            pSVar17 = soplex::operator<<(pSVar17," non-zeros");
            std::endl<char,std::char_traits<char>>(pSVar17->m_streams[pSVar17->m_verbosity]);
            pSVar17 = (this->super_SPxSimplifier<double>).spxout;
            (*pSVar17->_vptr_SPxOut[2])(pSVar17,&da_perm);
          }
          if ((double)local_15c * (this->super_SPxSimplifier<double>).m_minReduction <
              (double)iVar22) {
            *again = true;
          }
        }
      }
      if (newRhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(newRhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)newRhsVec.val.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)newRhsVec.val.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)newLhsVec.val.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (remRow.data != (bool *)0x0) {
        free(remRow.data);
        remRow.data = (bool *)0x0;
      }
      if (scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (classSize.data != (int *)0x0) {
        free(classSize.data);
        classSize.data = (int *)0x0;
      }
      if (pClass.data != (int *)0x0) {
        free(pClass.data);
      }
    }
  }
  return RVar14;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateRows(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate rows
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   // Possible extension: use generalized definition of duplicate rows according to Andersen and Andersen
   // However: the resulting sparsification is often very small since the involved rows are usually very sparse

   int remRows = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

#if SOPLEX_ROW_SINGLETON
   int rs_remRows = 0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 1)
      {
         removeRowSingleton(lp, row, i);
         rs_remRows++;
      }
   }

   if(rs_remRows > 0)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) <<
                    "Simplifier duplicate rows (row singleton stage) removed "
                    << rs_remRows << " rows, "
                    << rs_remRows << " non-zeros"
                    << std::endl;)
   }

#endif

   if(lp.nRows() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nRows());           // class of parallel rows
   DataArray<int>    classSize(lp.nRows());        // size of each class
   Array<R>   scale(lp.nRows());            // scaling factor for each row
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nRows());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nRows(), idxMem);           // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nRows();

   for(int i = 1; i < lp.nRows(); ++i)
   {
      pClass[i] = 0;
      scale[i]  = 0.0;
      classSize[i] = 0;
      idxSet.addIdx(i);
   }

   R oldVal = 0.0;

   // main loop
   for(int j = 0; j < lp.nCols(); ++j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);
         int  i   = col.index(k);

         if(scale[i] == 0.0)
            scale[i] = aij;

         m_classSetRows[pClass[i]].add(i, aij / scale[i]);

         if(--classSize[pClass[i]] == 0)
            idxSet.addIdx(pClass[i]);
      }

      // update each parallel class with non-zero column entry
      for(int m = 0; m < col.size(); ++m)
      {
         int k = pClass[col.index(m)];

         if(m_classSetRows[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled column values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetRows[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetRows[k].hasNaNs());
               assert(!m_classSetRows[k].hasInfs());
               SPxQuicksort(m_classSetRows[k].mem(), m_classSetRows[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetRows[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetRows[k].value(l), oldVal, this->epsZero()))
               {
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetRows[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetRows[k].value(l);
            }

            m_classSetRows[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remRow(lp.nRows());

   for(int k = 0; k < lp.nRows(); ++k)
      m_dupRows[k].clear();

   for(int k = 0; k < lp.nRows(); ++k)
   {
      remRow[k] = false;
      m_dupRows[pClass[k]].add(k, 0.0);
   }

   const int nRowsOld_tmp = lp.nRows();
   int* perm_tmp = nullptr;
   spx_alloc(perm_tmp, nRowsOld_tmp);

   for(int j = 0; j < nRowsOld_tmp; ++j)
   {
      perm_tmp[j] = 0;
   }

   int idxFirstDupRows = -1;
   int idxLastDupRows = -1;
   int numDelRows = 0;

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         idxLastDupRows = k;

         if(idxFirstDupRows < 0)
         {
            idxFirstDupRows = k;
         }

         for(int l = 1; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            perm_tmp[i] = -1;
         }

         numDelRows += (m_dupRows[k].size() - 1);
      }
   }

   {
      int k_tmp, j_tmp = -1;

      for(k_tmp = j_tmp = 0; k_tmp < nRowsOld_tmp; ++k_tmp)
      {
         if(perm_tmp[k_tmp] >= 0)
            perm_tmp[k_tmp] = j_tmp++;
      }
   }

   // store rhs and lhs changes for combined update
   bool doChangeRanges = false;
   VectorBase<R> newLhsVec(lp.lhs());
   VectorBase<R> newRhsVec(lp.rhs());

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM53 {} duplicate rows found\n", m_dupRows[k].size());

         m_stat[DUPLICATE_ROW] += m_dupRows[k].size() - 1;

         // index of one non-column singleton row in dupRows[k]
         int  rowIdx    = -1;
         int  maxLhsIdx = -1;
         int  minRhsIdx = -1;
         R maxLhs    = R(-infinity);
         R minRhs    = +R(infinity);

         DataArray<bool> isLhsEqualRhs(m_dupRows[k].size());

         // determine strictest bounds on constraint
         for(int l = 0; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            isLhsEqualRhs[l] = (lp.lhs(i) == lp.rhs(i));

            SOPLEX_ASSERT_WARN("WMAISM54", isNotZero(scale[i], R(1.0 / R(infinity))));

            if(rowIdx == -1)
            {
               rowIdx = i;
               maxLhs = lp.lhs(rowIdx);
               minRhs = lp.rhs(rowIdx);
            }
            else
            {
               R scaledLhs, scaledRhs;
               R factor = scale[rowIdx] / scale[i];

               if(factor > 0)
               {
                  scaledLhs = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) * factor;
                  scaledRhs = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) * factor;
               }
               else
               {
                  scaledLhs = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) * factor;
                  scaledRhs = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) * factor;
               }

               if(scaledLhs > maxLhs)
               {
                  maxLhs    = scaledLhs;
                  maxLhsIdx = i;
               }

               if(scaledRhs < minRhs)
               {
                  minRhs    = scaledRhs;
                  minRhsIdx = i;
               }

               remRow[i] = true;
            }
         }

         if(rowIdx != -1)
         {
            R newLhs = (maxLhs > lp.lhs(rowIdx)) ? maxLhs : lp.lhs(rowIdx);
            R newRhs = (minRhs < lp.rhs(rowIdx)) ? minRhs : lp.rhs(rowIdx);

            if(k == idxLastDupRows)
            {
               DataArray<int> da_perm(nRowsOld_tmp);

               for(int j = 0; j < nRowsOld_tmp; ++j)
               {
                  da_perm[j] = perm_tmp[j];
               }

               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm, isLhsEqualRhs, true,
                                             EQrel(newLhs, newRhs, this->tolerances()->epsilon()), this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }
            else
            {
               DataArray<int> da_perm_empty(0);
               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm_empty, isLhsEqualRhs, false, EQrel(newLhs, newRhs,
                                                   this->tolerances()->epsilon()),
                                             this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }

            if(maxLhs > lp.lhs(rowIdx) || minRhs < lp.rhs(rowIdx))
            {
               // modify lhs and rhs of constraint rowIdx
               doChangeRanges = true;

               if(LTrel(newRhs, newLhs, feastol()))
               {
                  SPxOut::debug(this, "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n", newLhs,
                                newRhs);
                  spx_free(perm_tmp);
                  return this->INFEASIBLE;
               }

               // if we accept the infeasibility we should clean up the values to avoid problems later
               if(newRhs < newLhs)
                  newRhs = newLhs;

               newLhsVec[rowIdx] = newLhs;
               newRhsVec[rowIdx] = newRhs;
            }
         }
      }
   }

   // change ranges for all modified constraints by one single call (more efficient)
   if(doChangeRanges)
   {
      lp.changeRange(newLhsVec, newRhsVec);
   }

   // remove all rows by one single method call (more efficient)
   const int nRowsOld = lp.nRows();
   int* perm = nullptr;
   spx_alloc(perm, nRowsOld);

   for(int i = 0; i < nRowsOld; ++i)
   {
      if(remRow[i])
      {
         perm[i] = -1;
         ++remRows;
         remNzos += lp.rowVector(i).size();
      }
      else
         perm[i] = 0;
   }

   lp.removeRows(perm);

   for(int i = 0; i < nRowsOld; ++i)
   {
      // assert that the pre-computed permutation was correct
      assert(perm[i] == perm_tmp[i]);

      // update the global index mapping
      if(perm[i] >= 0)
         m_rIdx[perm[i]] = m_rIdx[i];
   }

   spx_free(perm);
   spx_free(perm_tmp);

   if(remRows + remNzos > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate rows) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remRows > this->m_minReduction * oldRows)
         again = true;

   }

   return this->OKAY;
}